

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbfgsb.hpp
# Opt level: O0

int __thiscall lbfgsb::Optimizer::init(Optimizer *this,EVP_PKEY_CTX *ctx)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first_00;
  iterator __first_01;
  char *pcVar1;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  uint in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffffa8);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffffa8);
  __first._M_current._4_4_ = in_stack_ffffffffffffffc4;
  __first._M_current._0_4_ = in_stack_ffffffffffffffc0;
  __last._M_current._6_1_ = in_stack_ffffffffffffffbe;
  __last._M_current._0_6_ = in_stack_ffffffffffffffb8;
  __last._M_current._7_1_ = in_stack_ffffffffffffffbf;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            (__first,__last,(int *)this);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa8);
  __first_01 = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa8);
  uVar5 = 0;
  __first_00._M_current._4_4_ = in_stack_ffffffffffffffc4;
  __first_00._M_current._0_4_ = in_stack_ffffffffffffffc0;
  __last_00._M_current._6_1_ = in_stack_ffffffffffffffbe;
  __last_00._M_current._0_6_ = in_stack_ffffffffffffffb8;
  __last_00._M_current._7_1_ = in_stack_ffffffffffffffbf;
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (__first_00,__last_00,(int *)this);
  uVar4 = 0;
  std::fill_n<bool*,unsigned_long,int>
            ((bool *)__first_01._M_current,(ulong)uVar5 << 0x20,
             (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  uVar3 = 0;
  std::fill_n<int*,unsigned_long,int>
            (__first_01._M_current,CONCAT44(uVar5,uVar4),(int *)(ulong)in_stack_ffffffffffffffc0);
  uVar2 = 0;
  std::fill_n<double*,unsigned_long,int>
            ((double *)__first_01._M_current,CONCAT44(uVar5,uVar4),(int *)((ulong)uVar3 << 0x20));
  std::fill_n<char*,unsigned_long,char>
            ((char *)__first_01._M_current,CONCAT44(uVar5,uVar4),(char *)CONCAT44(uVar3,uVar2));
  pcVar1 = std::fill_n<char*,unsigned_long,char>
                     ((char *)__first_01._M_current,CONCAT44(uVar5,uVar4),
                      (char *)CONCAT44(uVar3,uVar2));
  return (int)pcVar1;
}

Assistant:

void init() {
                // Fill with 0.
                std::fill(wa.begin(), wa.end(), 0);
                std::fill(iwa.begin(), iwa.end(), 0);
                std::fill_n(lsave, N_LSAVE, 0);
                std::fill_n(isave, N_ISAVE, 0);
                std::fill_n(dsave, N_DSAVE, 0);
                std::fill_n(task, N_TASK, ' ');
                std::fill_n(csave, N_CSAVE, ' ');
            }